

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process_Unix::PrepareFileDescriptors(Process_Unix *this)

{
  int arguments_1;
  ILogger *this_00;
  char *arguments_2;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Process_Unix *pPStack_18;
  int status;
  Process_Unix *this_local;
  
  pPStack_18 = this;
  local_1c = posix_spawn_file_actions_init((posix_spawn_file_actions_t *)&this->child_fd_actions);
  bVar1 = local_1c == 0;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Process_Unix",&local_41)
    ;
    this_00 = gnilk::Logger::GetLogger(&local_40);
    arguments_1 = local_1c;
    arguments_2 = strerror(local_1c);
    gnilk::Log::Error<char_const*,int,char*>
              (this_00,"posix_spawn_file_actions_init %d, %s",arguments_1,arguments_2);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return bVar1;
}

Assistant:

bool Process_Unix::PrepareFileDescriptors() {
	int status = posix_spawn_file_actions_init(&child_fd_actions);
	if (status != 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_init %d, %s", status, strerror(status));
		return false;
	}
	return true;
}